

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

int evutil_read_file_(char *filename,char **content_out,size_t *len_out,int is_binary)

{
  int iVar1;
  int iVar2;
  char *ptr;
  ssize_t sVar3;
  uint uVar4;
  size_t sVar5;
  stat st;
  stat local_c0;
  
  if (content_out == (char **)0x0) {
    evutil_read_file__cold_2();
  }
  else if (len_out != (size_t *)0x0) {
    *content_out = (char *)0x0;
    *len_out = 0;
    iVar1 = evutil_open_closeonexec_(filename,0,0);
    if (iVar1 < 0) {
      iVar1 = -1;
    }
    else {
      iVar2 = fstat(iVar1,&local_c0);
      if (((ulong)local_c0.st_size < 0x7fffffffffffffff && iVar2 == 0) &&
         (ptr = (char *)event_mm_malloc_(local_c0.st_size + 1), ptr != (char *)0x0)) {
        sVar5 = 0;
        while( true ) {
          sVar3 = read(iVar1,ptr + sVar5,local_c0.st_size - sVar5);
          uVar4 = (uint)sVar3;
          if ((int)uVar4 < 1) break;
          sVar5 = sVar5 + (uVar4 & 0x7fffffff);
          if ((ulong)local_c0.st_size <= sVar5) {
            close(iVar1);
LAB_0024e1f2:
            ptr[sVar5] = '\0';
            *len_out = sVar5;
            *content_out = ptr;
            return 0;
          }
        }
        close(iVar1);
        if (-1 < (int)uVar4) goto LAB_0024e1f2;
        event_mm_free_(ptr);
      }
      else {
        close(iVar1);
      }
      iVar1 = -2;
    }
    return iVar1;
  }
  evutil_read_file__cold_1();
}

Assistant:

int
evutil_read_file_(const char *filename, char **content_out, size_t *len_out,
    int is_binary)
{
	int fd, r;
	struct stat st;
	char *mem;
	size_t read_so_far=0;
	int mode = O_RDONLY;

	EVUTIL_ASSERT(content_out);
	EVUTIL_ASSERT(len_out);
	*content_out = NULL;
	*len_out = 0;

#ifdef O_BINARY
	if (is_binary)
		mode |= O_BINARY;
#endif

	fd = evutil_open_closeonexec_(filename, mode, 0);
	if (fd < 0)
		return -1;
	if (fstat(fd, &st) || st.st_size < 0 ||
	    st.st_size > EV_SSIZE_MAX-1 ) {
		close(fd);
		return -2;
	}
	mem = mm_malloc((size_t)st.st_size + 1);
	if (!mem) {
		close(fd);
		return -2;
	}
	read_so_far = 0;
#ifdef _WIN32
#define N_TO_READ(x) ((x) > INT_MAX) ? INT_MAX : ((int)(x))
#else
#define N_TO_READ(x) (x)
#endif
	while ((r = read(fd, mem+read_so_far, N_TO_READ(st.st_size - read_so_far))) > 0) {
		read_so_far += r;
		if (read_so_far >= (size_t)st.st_size)
			break;
		EVUTIL_ASSERT(read_so_far < (size_t)st.st_size);
	}
	close(fd);
	if (r < 0) {
		mm_free(mem);
		return -2;
	}
	mem[read_so_far] = 0;

	*len_out = read_so_far;
	*content_out = mem;
	return 0;
}